

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall compiler::EmissionContext::PopScope(EmissionContext *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  reference pvVar4;
  string local_48;
  allocator<char> local_21;
  
  puVar2 = (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"PopScope called with empty scopeStartIndex",&local_21);
  Error::assertWithPanic(puVar2 != puVar3,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->scopeStartIndex,
                      ((long)(this->scopeStartIndex).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->scopeStartIndex).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  this->firstFreeVariablesIndex = *pvVar4;
  ppuVar1 = &(this->scopeStartIndex).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void PopScope() {
    Error::assertWithPanic(!this->scopeStartIndex.empty(), "PopScope called with empty scopeStartIndex");

    this->firstFreeVariablesIndex = this->scopeStartIndex.at(this->scopeStartIndex.size() - 1);
    this->scopeStartIndex.pop_back();
  }